

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUICheckBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUICheckBox::draw(CGUICheckBox *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  u32 uVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  u32 uVar10;
  long *plVar11;
  long *plVar12;
  undefined8 *puVar13;
  int iVar14;
  rect<int> frameRect;
  undefined1 *puVar15;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  string<wchar_t> local_50;
  
  if (this->field_0xa0 == '\x01') {
    plVar11 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if (plVar11 != (long *)0x0) {
      plVar12 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
      local_68 = *(int *)&this->field_0x40;
      iStack_64 = *(int *)&this->field_0x44;
      iStack_60 = *(int *)&this->field_0x48;
      iStack_5c = *(int *)&this->field_0x4c;
      if (this->Background == true) {
        uVar7 = (**(code **)*plVar11)(plVar11,2);
        (**(code **)(*plVar12 + 0x198))(plVar12,uVar7,&local_68,&this->field_0x50);
      }
      if (this->Border == true) {
        (**(code **)(*plVar11 + 0x70))(plVar11,this,0,1,0,&local_68,&this->field_0x50);
        iVar8 = (**(code **)(*plVar11 + 0x10))(plVar11,8);
        local_68 = local_68 + iVar8;
        iVar8 = (**(code **)(*plVar11 + 0x10))(plVar11,8);
        iStack_60 = iStack_60 - iVar8;
      }
      iVar8 = (**(code **)(*plVar11 + 0x10))(plVar11,3);
      iStack_74 = ((iStack_5c - iVar8) - iStack_64) / 2 + iStack_64;
      local_78 = local_68;
      iStack_70 = local_68 + iVar8;
      iStack_6c = iStack_74 + iVar8;
      cVar4 = (**(code **)(*(long *)this + 0x90))(this);
      cVar6 = '\x17';
      if (cVar4 != '\0') {
        cVar6 = (this->Pressed & 1U) * '\x02' + '\x16';
      }
      uVar7 = (**(code **)*plVar11)(plVar11,cVar6);
      puVar1 = &this->field_0x50;
      puVar15 = puVar1;
      (**(code **)(*plVar11 + 0x70))(plVar11,this,uVar7,0,1,&local_78,puVar1);
      if (this->Checked == true) {
        iVar9 = iStack_70 + local_78;
        iVar14 = iStack_6c + iStack_74;
        uVar3 = this->CheckTime;
        uVar10 = os::Timer::getTime();
        (**(code **)(*plVar11 + 0xa0))
                  (plVar11,this,10,CONCAT44(iVar14 / 2,iVar9 / 2),uVar3,uVar10,
                   (ulong)puVar15 & 0xffffffff00000000,puVar1);
      }
      if (*(int *)&this->field_0xb0 != 0) {
        iStack_74 = iStack_64;
        iStack_70 = iStack_60;
        iStack_6c = iStack_5c;
        local_78 = local_68 + iVar8 + 5;
        puVar13 = (undefined8 *)(**(code **)(*plVar11 + 0x30))(plVar11,0);
        if (puVar13 != (undefined8 *)0x0) {
          paVar2 = &local_50.str.field_2;
          local_50.str._M_string_length = 0;
          local_50.str.field_2._M_local_buf[0] = L'\0';
          local_50.str._M_dataplus._M_p = (pointer)paVar2;
          core::string<wchar_t>::operator=(&local_50,*(wchar_t **)&this->field_0xa8);
          bVar5 = (**(code **)(*(long *)this + 0x90))(this);
          uVar7 = (**(code **)*plVar11)(plVar11,bVar5 ^ 9);
          (**(code **)*puVar13)(puVar13,&local_50,&local_78,uVar7,0,1,puVar1);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_50.str._M_dataplus._M_p != paVar2) {
            operator_delete(local_50.str._M_dataplus._M_p,
                            CONCAT44(local_50.str.field_2._M_local_buf[1],
                                     local_50.str.field_2._M_local_buf[0]) * 4 + 4);
          }
        }
      }
    }
    cVar6 = (**(code **)(*(long *)this + 0x68))(this);
    if (cVar6 != '\0') {
      for (puVar13 = *(undefined8 **)&this->field_0x8; puVar13 != (undefined8 *)&this->field_0x8;
          puVar13 = (undefined8 *)*puVar13) {
        (**(code **)(*(long *)puVar13[2] + 0x50))();
      }
    }
  }
  return;
}

Assistant:

void CGUICheckBox::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		video::IVideoDriver *driver = Environment->getVideoDriver();
		core::rect<s32> frameRect(AbsoluteRect);

		// draw background
		if (Background) {
			video::SColor bgColor = skin->getColor(gui::EGDC_3D_FACE);
			driver->draw2DRectangle(bgColor, frameRect, &AbsoluteClippingRect);
		}

		// draw the border
		if (Border) {
			skin->draw3DSunkenPane(this, 0, true, false, frameRect, &AbsoluteClippingRect);
			frameRect.UpperLeftCorner.X += skin->getSize(EGDS_TEXT_DISTANCE_X);
			frameRect.LowerRightCorner.X -= skin->getSize(EGDS_TEXT_DISTANCE_X);
		}

		const s32 height = skin->getSize(EGDS_CHECK_BOX_WIDTH);

		// the rectangle around the "checked" area.
		core::rect<s32> checkRect(frameRect.UpperLeftCorner.X,
				((frameRect.getHeight() - height) / 2) + frameRect.UpperLeftCorner.Y,
				0, 0);

		checkRect.LowerRightCorner.X = checkRect.UpperLeftCorner.X + height;
		checkRect.LowerRightCorner.Y = checkRect.UpperLeftCorner.Y + height;

		EGUI_DEFAULT_COLOR col = EGDC_GRAY_EDITABLE;
		if (isEnabled())
			col = Pressed ? EGDC_FOCUSED_EDITABLE : EGDC_EDITABLE;
		skin->draw3DSunkenPane(this, skin->getColor(col),
				false, true, checkRect, &AbsoluteClippingRect);

		// the checked icon
		if (Checked) {
			skin->drawIcon(this, EGDI_CHECK_BOX_CHECKED, checkRect.getCenter(),
					CheckTime, os::Timer::getTime(), false, &AbsoluteClippingRect);
		}

		// associated text
		if (Text.size()) {
			checkRect = frameRect;
			checkRect.UpperLeftCorner.X += height + 5;

			IGUIFont *font = skin->getFont();
			if (font) {
				font->draw(Text.c_str(), checkRect,
						skin->getColor(isEnabled() ? EGDC_BUTTON_TEXT : EGDC_GRAY_TEXT), false, true, &AbsoluteClippingRect);
			}
		}
	}
	IGUIElement::draw();
}